

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal-base.h
# Opt level: O1

void __thiscall dynamicgraph::SignalBase<int>::trace(SignalBase<int> *this,ostream *param_1)

{
  ExceptionSignal *this_00;
  ErrorCodeEnum local_44;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  this_00 = (ExceptionSignal *)__cxa_allocate_exception(0x30);
  local_44 = SET_IMPOSSIBLE;
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_40,"Trace operation not possible with this signal. ","");
  dynamicgraph::ExceptionSignal::ExceptionSignal
            (this_00,&local_44,(string *)local_40,"(while trying to trace %s).",
             (this->name)._M_dataplus._M_p);
  __cxa_throw(this_00,&ExceptionSignal::typeinfo,ExceptionAbstract::~ExceptionAbstract);
}

Assistant:

virtual void trace(std::ostream &) const {
    DG_THROW ExceptionSignal(ExceptionSignal::SET_IMPOSSIBLE,
                             "Trace operation not possible with this signal. ",
                             "(while trying to trace %s).",
                             this->getName().c_str());
  }